

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (Result<CBlockIndex_*> *__return_storage_ptr__,ChainstateManager *this,
          AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  pointer ppCVar7;
  tuple<Chainstate_*,_std::default_delete<Chainstate>_> tVar8;
  CTxMemPool *this_00;
  optional<uint256> from_snapshot_blockhash;
  string original;
  path leveldb_name;
  long lVar9;
  __single_object _Var10;
  __single_object *p_Var11;
  bool bVar12;
  Chainstate *__tmp;
  CBlockIndex *pCVar13;
  Chainstate *pCVar14;
  __uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true> this_01;
  unsigned_long uVar15;
  CBlockIndex *pCVar16;
  _Optional_payload_base<int> _Var17;
  CCoinsViewCache *this_02;
  size_t sVar18;
  SnapshotMetadata *args;
  ulong uVar19;
  CBlockIndex *pb;
  undefined4 uVar20;
  undefined1 *puVar21;
  ChainstateManager *pCVar22;
  ulong uVar23;
  long *plVar24;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 in_stack_fffffffffffffa08 [12];
  undefined4 uVar25;
  undefined8 in_stack_fffffffffffffa18;
  double dVar26;
  undefined8 in_stack_fffffffffffffa20;
  undefined8 uVar27;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var28;
  __single_object snapshot_chainstate;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  long local_598;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  long *local_580;
  long local_578;
  long local_570 [2];
  undefined1 local_560 [32];
  _Alloc_hider local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  Error local_520;
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  undefined1 local_4c0 [32];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  Error local_480;
  string heights_formatted;
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  long *local_400;
  long local_3f8;
  long local_3f0 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  undefined1 local_3d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  bilingual_str local_3a0;
  Error local_360;
  path local_320;
  long *local_2f8 [2];
  long local_2e8 [2];
  bilingual_str local_2d8;
  long *local_298;
  long local_290;
  long local_288 [2];
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  undefined8 uStack_240;
  long *local_238;
  long local_230;
  long local_228 [2];
  bilingual_str local_218;
  ChainstateManager *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [24];
  CBlockIndex *local_1b0;
  __native_type local_1a8;
  _Base_ptr p_Stack_180;
  _Base_ptr local_178;
  size_t local_170;
  undefined1 local_168 [24];
  _Base_ptr local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long local_138;
  undefined1 local_130 [24];
  string ret;
  string local_f8 [16];
  _Rb_tree_node_base local_e8;
  char local_c8;
  _Base_ptr local_b8;
  size_t local_b0;
  _Base_ptr local_a8 [2];
  _Base_ptr local_98;
  _Base_ptr local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 local_70 [24];
  uint256 base_blockhash;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._16_4_ =
       *(undefined4 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._20_4_ =
       *(undefined4 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x14);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._24_4_ =
       *(undefined4 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._28_4_ =
       *(undefined4 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x1c);
  args = metadata;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,in_memory);
  SnapshotBlockhash((optional<uint256> *)&ret,this);
  if (local_f8[0] == (string)0x1) {
    local_b8 = (_Base_ptr)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Can\'t activate a snapshot-based chainstate more than once","");
    local_98 = (_Base_ptr)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8,(long)&local_b8->_M_color + local_b0);
    puVar21 = local_70 + 8;
    local_78 = puVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8,(long)&local_b8->_M_color + local_b0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if (local_98 == (_Base_ptr)local_88) {
      *puVar1 = CONCAT71(local_88._1_7_,local_88[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_88._8_8_;
    }
    else {
      *(_Base_ptr *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_98;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_88._1_7_,local_88[0]);
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_90;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_78 == puVar21) {
      *puVar1 = CONCAT71(local_70._9_7_,local_70[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_70._16_8_;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_70._9_7_,local_70[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_70._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_70[8] = 0;
    local_70._0_8_ = 0;
    local_88[0] = 0;
    local_90 = (_Base_ptr)0x0;
    local_98 = (_Base_ptr)local_88;
    local_78 = puVar21;
    if (local_b8 != (_Base_ptr)local_a8) {
      operator_delete(local_b8,(ulong)((long)&local_a8[0]->_M_color + 1));
    }
    goto LAB_00b02f08;
  }
  criticalblock43.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock43.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
  CChainParams::AssumeutxoForBlockhash
            ((optional<AssumeutxoData> *)&ret,(this->m_options).chainparams,&base_blockhash);
  uVar20 = SUB84((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000081,in_memory),0);
  if (local_c8 == '\0') {
    CChainParams::GetAvailableSnapshotHeights
              ((vector<int,_std::allocator<int>_> *)&cleanup_bad_snapshot,
               (this->m_options).chainparams);
    p_Var11 = cleanup_bad_snapshot.snapshot_chainstate;
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_allocated_capacity = ret.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (cleanup_bad_snapshot.this != (ChainstateManager *)cleanup_bad_snapshot.snapshot_chainstate)
    {
      bVar12 = true;
      pCVar22 = cleanup_bad_snapshot.this;
      do {
        if (!bVar12) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&ret,", ");
        }
        util::ToString<int>((string *)&criticalblock48,(int *)pCVar22);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&ret,(char *)criticalblock48.super_unique_lock._M_device,
                   CONCAT71(criticalblock48.super_unique_lock._9_7_,
                            criticalblock48.super_unique_lock._M_owns));
        if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3d0) {
          operator_delete(criticalblock48.super_unique_lock._M_device,local_3d0._0_8_ + 1);
        }
        pCVar22 = (ChainstateManager *)
                  ((long)&(pCVar22->m_ibd_chainstate)._M_t.
                          super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                          super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                          super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 4);
        bVar12 = false;
      } while (pCVar22 != (ChainstateManager *)p_Var11);
    }
    paVar2 = &ret.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p == paVar2) {
      heights_formatted.field_2._8_4_ = ret.field_2._8_4_;
      heights_formatted.field_2._12_4_ = ret.field_2._12_4_;
      heights_formatted._M_dataplus._M_p = (pointer)&heights_formatted.field_2;
    }
    else {
      heights_formatted._M_dataplus = ret._M_dataplus;
    }
    heights_formatted.field_2._M_allocated_capacity = ret.field_2._M_allocated_capacity;
    heights_formatted._M_string_length = ret._M_string_length;
    local_178 = (_Base_ptr)local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,
               "assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"
               ,"");
    ret._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ret,local_178,(undefined1 *)((long)&local_178->_M_color + local_170));
    local_f8._0_8_ = &local_e8;
    std::__cxx11::string::_M_construct<char*>
              (local_f8,local_178,(undefined1 *)((long)&local_178->_M_color + local_170));
    base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((bilingual_str *)(local_168 + 0x10),(tinyformat *)&ret,
               (bilingual_str *)&criticalblock48,&heights_formatted,args_1);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._16_8_ == &local_148) {
      *puVar1 = CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = local_148._8_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_168._16_8_;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
    }
    lVar9 = (long)local_130 + 8;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_150;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if (local_138 == lVar9) {
      *puVar1 = CONCAT71(local_130._9_7_,local_130[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = local_130._16_8_
      ;
    }
    else {
      *(long *)((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
           local_138;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_130._9_7_,local_130[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_130._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_130[8] = 0;
    local_130._0_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_150 = (_Base_ptr)0x0;
    local_168._16_8_ = &local_148;
    local_138 = lVar9;
    if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3d0) {
      operator_delete(criticalblock48.super_unique_lock._M_device,local_3d0._0_8_ + 1);
    }
    if ((_Rb_tree_node_base *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p != paVar2) {
      operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != (_Base_ptr)local_168) {
      operator_delete(local_178,local_168._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)heights_formatted._M_dataplus._M_p != &heights_formatted.field_2) {
      operator_delete(heights_formatted._M_dataplus._M_p,
                      heights_formatted.field_2._M_allocated_capacity + 1);
    }
    if (cleanup_bad_snapshot.this != (ChainstateManager *)0x0) {
      puVar21 = (undefined1 *)(local_598 - (long)cleanup_bad_snapshot.this);
      pCVar22 = cleanup_bad_snapshot.this;
LAB_00b024b0:
      operator_delete(pCVar22,(ulong)puVar21);
    }
LAB_00b024b5:
    pCVar13 = (CBlockIndex *)0x0;
LAB_00b02587:
    bVar12 = false;
  }
  else {
    pCVar13 = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,&base_blockhash);
    if (pCVar13 == (CBlockIndex *)0x0) {
      local_1d8 = (ChainstateManager *)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,
                 "The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"
                 ,"");
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ret,local_1d8,
                 (long)((local_1d8->m_warningcache)._M_elems + -1) + local_1d0);
      local_f8._0_8_ = &local_e8;
      std::__cxx11::string::_M_construct<char*>
                (local_f8,local_1d8,(long)((local_1d8->m_warningcache)._M_elems + -1) + local_1d0);
      base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)(local_1c8 + 0x10),(tinyformat *)&ret,
                 (bilingual_str *)&criticalblock48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if ((__native_type *)local_1c8._16_8_ == &local_1a8) {
        *puVar1 = CONCAT71(local_1a8.__align._1_7_,local_1a8.__size[0]);
        ((duration *)
        ((long)&(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_CBlockIndex_*>.
                super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18))->__r =
             local_1a8._8_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_1c8._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_1a8.__align._1_7_,local_1a8.__size[0]);
      }
      pcVar4 = local_1a8.__size + 0x20;
      *(CBlockIndex **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_1b0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((char *)local_1a8._16_8_ == pcVar4) {
        *puVar1 = CONCAT71(local_1a8._33_7_,local_1a8.__size[0x20]);
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = p_Stack_180;
      }
      else {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_1a8._16_8_;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_1a8._33_7_,local_1a8.__size[0x20]);
      }
      *(__pthread_internal_list **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_1a8.__data.__list.__prev;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_1a8.__size[0x20] = '\0';
      local_1a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
      local_1a8.__size[0] = '\0';
      local_1b0 = (CBlockIndex *)0x0;
      local_1c8._16_8_ = &local_1a8;
      local_1a8._16_8_ = pcVar4;
      if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3d0) {
        operator_delete(criticalblock48.super_unique_lock._M_device,local_3d0._0_8_ + 1);
      }
      if ((_Rb_tree_node_base *)local_f8._0_8_ != &local_e8) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != &ret.field_2) {
        operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != (ChainstateManager *)local_1c8) {
        puVar21 = (undefined1 *)(local_1c8._0_8_ + 1);
        pCVar22 = local_1d8;
        goto LAB_00b024b0;
      }
      goto LAB_00b024b5;
    }
    if ((pCVar13->nStatus & 0x60) != 0) {
      local_238 = local_228;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"The base block header (%s) is part of an invalid chain","");
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ret,local_238,local_230 + (long)local_238);
      local_f8._0_8_ = &local_e8;
      std::__cxx11::string::_M_construct<char*>(local_f8,local_238,local_230 + (long)local_238);
      base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock48,&base_blockhash);
      tinyformat::format<std::__cxx11::string>
                (&local_218,(tinyformat *)&ret,(bilingual_str *)&criticalblock48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      paVar2 = &local_218.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218.original._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_218.original.field_2._M_allocated_capacity._1_7_,
                           local_218.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_218.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
             local_218.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_218.original.field_2._M_allocated_capacity._1_7_,
                      local_218.original.field_2._M_local_buf[0]);
      }
      paVar3 = &local_218.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
           local_218.original._M_string_length;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218.translated._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_218.translated.field_2._M_allocated_capacity._1_7_,
                           local_218.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_218.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_218.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_218.translated.field_2._M_allocated_capacity._1_7_,
                      local_218.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_218.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_218.translated.field_2._M_local_buf[0] = '\0';
      local_218.translated._M_string_length = 0;
      local_218.original.field_2._M_local_buf[0] = '\0';
      local_218.original._M_string_length = 0;
      local_218.original._M_dataplus._M_p = (pointer)paVar2;
      local_218.translated._M_dataplus._M_p = (pointer)paVar3;
      if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3d0) {
        operator_delete(criticalblock48.super_unique_lock._M_device,local_3d0._0_8_ + 1);
      }
      if ((_Rb_tree_node_base *)local_f8._0_8_ != &local_e8) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_e8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != &ret.field_2) {
        operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
      }
      plVar24 = local_238;
      if (local_238 != local_228) {
LAB_00b0257f:
        operator_delete(plVar24,local_228[0] + 1);
      }
      goto LAB_00b02587;
    }
    if ((this->m_best_header == (CBlockIndex *)0x0) ||
       (pCVar16 = CBlockIndex::GetAncestor(this->m_best_header,pCVar13->nHeight), pCVar16 != pCVar13
       )) {
      local_298 = local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,
                 "A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo."
                 ,"");
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_298,local_290 + (long)local_298);
      local_258 = &local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_298,local_290 + (long)local_298);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      if (local_278 == &local_268) {
        *puVar1 = CONCAT71(uStack_267,local_268);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) = uStack_260;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = local_278;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(uStack_267,local_268);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) = local_270;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if (local_258 == &local_248) {
        *puVar1 = CONCAT71(uStack_247,local_248);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) = uStack_240;
      }
      else {
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = local_258;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(uStack_247,local_248);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) = local_250;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_248 = 0;
      local_250 = 0;
      local_268 = 0;
      local_270 = 0;
      local_228[0] = local_288[0];
      plVar24 = local_298;
      local_278 = &local_268;
      local_258 = &local_248;
      if (local_298 != local_288) goto LAB_00b0257f;
      goto LAB_00b02587;
    }
    this_00 = this->m_active_chainstate->m_mempool;
    bVar12 = true;
    if ((this_00 != (CTxMemPool *)0x0) && (uVar15 = CTxMemPool::size(this_00), uVar15 != 0)) {
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f8,"Can\'t activate a snapshot when mempool not empty","");
      original._M_string_length._4_4_ = uVar20;
      original._0_12_ = in_stack_fffffffffffffa08;
      original.field_2._M_allocated_capacity = in_stack_fffffffffffffa18;
      original.field_2._8_8_ = in_stack_fffffffffffffa20;
      Untranslated(&local_2d8,original);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      paVar2 = &local_2d8.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.original._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_2d8.original.field_2._M_allocated_capacity._1_7_,
                           local_2d8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_2d8.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
             local_2d8.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_2d8.original.field_2._M_allocated_capacity._1_7_,
                      local_2d8.original.field_2._M_local_buf[0]);
      }
      paVar3 = &local_2d8.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
           local_2d8.original._M_string_length;
      local_2d8.original._M_string_length = 0;
      local_2d8.original.field_2._M_local_buf[0] = '\0';
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.translated._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_2d8.translated.field_2._M_allocated_capacity._1_7_,
                           local_2d8.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_2d8.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_2d8.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_2d8.translated.field_2._M_allocated_capacity._1_7_,
                      local_2d8.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_2d8.translated._M_string_length;
      local_2d8.translated._M_string_length = 0;
      bVar12 = false;
      local_2d8.translated.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_2d8.original._M_dataplus._M_p = (pointer)paVar2;
      local_2d8.translated._M_dataplus._M_p = (pointer)paVar3;
      util::Error::~Error((Error *)&local_2d8);
      local_228[0] = local_2e8[0];
      plVar24 = local_2f8[0];
      if (local_2f8[0] != local_2e8) goto LAB_00b0257f;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
  if (!bVar12) goto LAB_00b02f08;
  ret._M_dataplus._M_p = (pointer)&cs_main;
  ret._M_string_length = ret._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&ret);
  pCVar14 = ActiveChainstate(this);
  sVar18 = pCVar14->m_coinsdb_cache_size_bytes;
  pCVar14 = ActiveChainstate(this);
  sVar6 = pCVar14->m_coinstip_cache_size_bytes;
  pCVar14 = ActiveChainstate(this);
  _Var28._M_head_impl = (_Impl *)(double)(long)sVar6;
  uVar19 = (ulong)((double)_Var28._M_head_impl * 0.01);
  dVar26 = (double)(long)sVar18;
  uVar27 = 0;
  uVar23 = (ulong)(dVar26 * 0.01);
  Chainstate::ResizeCoinsCaches
            (pCVar14,(long)((double)_Var28._M_head_impl * 0.01 - 9.223372036854776e+18) &
                     (long)uVar19 >> 0x3f | uVar19,
             (long)(dVar26 * 0.01 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&ret);
  criticalblock48.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock48.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock48.super_unique_lock);
  this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)operator_new(0xe8);
  ret.field_2._M_allocated_capacity =
       CONCAT44(base_blockhash.super_base_blob<256U>.m_data._M_elems._20_4_,
                base_blockhash.super_base_blob<256U>.m_data._M_elems._16_4_);
  ret.field_2._8_8_ =
       CONCAT44(base_blockhash.super_base_blob<256U>.m_data._M_elems._28_4_,
                base_blockhash.super_base_blob<256U>.m_data._M_elems._24_4_);
  ret._M_dataplus._M_p = (pointer)base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
  ret._M_string_length._0_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
  ret._M_string_length._1_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
  ret._M_string_length._2_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
  ret._M_string_length._3_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  ret._M_string_length._4_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  ret._M_string_length._5_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  ret._M_string_length._6_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  ret._M_string_length._7_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_f8[0] = (string)0x1;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._8_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._9_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._10_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._11_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._12_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._13_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._14_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._15_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._0_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._1_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[1];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._2_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[2];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._3_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[3];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._4_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[4];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._5_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[5];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._6_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[6];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._7_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[7];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._16_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._17_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._18_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._19_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._20_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._21_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._22_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._23_1_ =
       base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17];
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_payload._24_8_ = ret.field_2._8_8_;
  from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = true;
  uVar25 = uVar20;
  Chainstate::Chainstate
            ((Chainstate *)
             this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,(CTxMemPool *)0x0,
             &this->m_blockman,this,from_snapshot_blockhash);
  snapshot_chainstate._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
       (__uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true>)
       (__uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true>)
       this_01.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock48.super_unique_lock);
  ret._M_dataplus._M_p = (pointer)&cs_main;
  ret._M_string_length = ret._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&ret);
  _Var10 = snapshot_chainstate;
  criticalblock48.super_unique_lock._M_device = (mutex_type *)0xf77cd6;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_320,(char **)&criticalblock48,auto_format);
  uVar19 = (ulong)(dVar26 * 0.99);
  leveldb_name.super_path._M_pathname._M_string_length._4_4_ = uVar25;
  leveldb_name.super_path._M_pathname._0_12_ = in_stack_fffffffffffffa08;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)dVar26;
  leveldb_name.super_path._M_pathname.field_2._8_8_ = uVar27;
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var28._M_head_impl;
  Chainstate::InitCoinsDB
            ((Chainstate *)
             _Var10._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
             (long)(dVar26 * 0.99 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19,
             SUB41(uVar20,0),false,leveldb_name);
  std::filesystem::__cxx11::path::~path(&local_320);
  uVar19 = (ulong)((double)_Var28._M_head_impl * 0.99);
  Chainstate::InitCoinsCache
            ((Chainstate *)
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
             (long)((double)_Var28._M_head_impl * 0.99 - 9.223372036854776e+18) &
             (long)uVar19 >> 0x3f | uVar19);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&ret);
  cleanup_bad_snapshot.snapshot_chainstate = &snapshot_chainstate;
  cleanup_bad_snapshot.this = this;
  PopulateAndValidateSnapshot
            ((Result<void> *)&ret,this,
             (Chainstate *)
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,coins_file,metadata);
  if ((__index_type)local_e8._M_left == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&ret);
    criticalblock48.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock48.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock48.super_unique_lock);
    pCVar14 = ActiveChainstate(this);
    ppCVar7 = (pCVar14->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar7 ==
        (pCVar14->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar16 = (CBlockIndex *)0x0;
    }
    else {
      pCVar16 = ppCVar7[-1];
    }
    if (*(long *)((long)snapshot_chainstate._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x60) ==
        *(long *)((long)snapshot_chainstate._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x58)) {
      pb = (CBlockIndex *)0x0;
    }
    else {
      pb = *(CBlockIndex **)
            (*(long *)((long)snapshot_chainstate._M_t.
                             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x60) + -8);
    }
    bVar12 = ::node::CBlockIndexWorkComparator::operator()
                       ((CBlockIndexWorkComparator *)&ret,pCVar16,pb);
    if (bVar12) {
      if ((SUB41(uVar20,0) != false) ||
         (bVar12 = ::node::WriteSnapshotBaseBlockhash
                             ((Chainstate *)
                              snapshot_chainstate._M_t.
                              super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                              .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl), bVar12)) {
        _Var10._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        tVar8.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>)
             (this->m_snapshot_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        if (tVar8.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl !=
            (_Head_base<0UL,_Chainstate_*,_false>)0x0) {
          __assert_fail("!m_snapshot_chainstate",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1696,
                        "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                       );
        }
        (this->m_snapshot_chainstate)._M_t.
        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
             (Chainstate *)
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        snapshot_chainstate._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
        ._M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
             (__uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true>)
             (__uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true>)
             tVar8.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        bVar12 = Chainstate::LoadChainTip
                           ((Chainstate *)
                            _Var10._M_t.
                            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t
                            .super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        if (!bVar12) {
          __assert_fail("chaintip_loaded",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x1699,
                        "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                       );
        }
        uVar15 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
        ret._M_dataplus._M_p._0_1_ = uVar15 == 0;
        inline_assertion_check<true,bool>
                  ((bool *)&ret,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                   ,0x169d,"ActivateSnapshot","m_active_chainstate->m_mempool->size() == 0");
        ret._M_dataplus._M_p._0_1_ =
             ((this->m_snapshot_chainstate)._M_t.
              super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
              super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
              super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool ==
             (CTxMemPool *)0x0;
        inline_assertion_check<true,bool>
                  ((bool *)&ret,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                   ,0x169e,"ActivateSnapshot","!m_snapshot_chainstate->m_mempool");
        pCVar14 = this->m_active_chainstate;
        ((this->m_snapshot_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool = pCVar14->m_mempool;
        pCVar14->m_mempool = (CTxMemPool *)0x0;
        pCVar14 = (this->m_snapshot_chainstate)._M_t.
                  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        this->m_active_chainstate = pCVar14;
        if (pCVar14 == (Chainstate *)0x0) {
          pCVar16 = (CBlockIndex *)0x0;
        }
        else {
          pCVar16 = Chainstate::SnapshotBase(pCVar14);
        }
        if (pCVar16 == (CBlockIndex *)0x0) {
          _Var17._M_payload = (_Storage<int,_true>)0x0;
          _Var17._M_engaged = false;
          _Var17._5_3_ = 0;
        }
        else {
          _Var17 = (_Optional_payload_base<int>)((ulong)(uint)pCVar16->nHeight | 0x100000000);
        }
        (this->m_blockman).m_snapshot_height.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> = _Var17;
        base_blob<256u>::ToString_abi_cxx11_(&ret,&base_blockhash);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "ActivateSnapshot";
        logging_function._M_len = 0x10;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x16a4,ALL,Info,(ConstevalFormatString<1U>)0xfd60ce,
                   &ret);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ret._M_dataplus._M_p != &ret.field_2) {
          operator_delete(ret._M_dataplus._M_p,ret.field_2._M_allocated_capacity + 1);
        }
        this_02 = Chainstate::CoinsTip
                            ((this->m_snapshot_chainstate)._M_t.
                             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        sVar18 = CCoinsViewCache::DynamicMemoryUsage(this_02);
        ret._M_dataplus._M_p = (pointer)(sVar18 / 1000000);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x5e;
        logging_function_00._M_str = "ActivateSnapshot";
        logging_function_00._M_len = 0x10;
        LogPrintFormatInternal<unsigned_long>
                  (logging_function_00,source_file_00,0x16a6,ALL,Info,
                   (ConstevalFormatString<1U>)0xfd60fd,(unsigned_long *)&ret);
        MaybeRebalanceCaches(this);
        *(CBlockIndex **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = pCVar13;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\x01';
      }
      else {
        local_580 = local_570;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_580,"could not write base blockhash","");
        local_560._0_8_ = local_560 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,local_580,local_578 + (long)local_580);
        local_540._M_p = (pointer)&local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_540,local_580,local_578 + (long)local_580);
        ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                  (&local_520,&cleanup_bad_snapshot,(bilingual_str *)local_560);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
        paVar2 = &local_520.message.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520.message.original._M_dataplus._M_p == paVar2) {
          *puVar1 = CONCAT71(local_520.message.original.field_2._M_allocated_capacity._1_7_,
                             local_520.message.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
               local_520.message.original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
               local_520.message.original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
               CONCAT71(local_520.message.original.field_2._M_allocated_capacity._1_7_,
                        local_520.message.original.field_2._M_local_buf[0]);
        }
        paVar3 = &local_520.message.translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
             local_520.message.original._M_string_length;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_CBlockIndex_*>.
                         super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                         super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                         super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520.message.translated._M_dataplus._M_p == paVar3) {
          *puVar1 = CONCAT71(local_520.message.translated.field_2._M_allocated_capacity._1_7_,
                             local_520.message.translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
               local_520.message.translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_CBlockIndex_*>.
                   super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                   super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                   super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
               local_520.message.translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_CBlockIndex_*>.
                            super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                            super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                            super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
               CONCAT71(local_520.message.translated.field_2._M_allocated_capacity._1_7_,
                        local_520.message.translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
             local_520.message.translated._M_string_length;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
        local_520.message.translated.field_2._M_local_buf[0] = '\0';
        local_520.message.translated._M_string_length = 0;
        local_520.message.original.field_2._M_local_buf[0] = '\0';
        local_520.message.original._M_string_length = 0;
        local_520.message.original._M_dataplus._M_p = (pointer)paVar2;
        local_520.message.translated._M_dataplus._M_p = (pointer)paVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_p != &local_530) {
          operator_delete(local_540._M_p,local_530._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_560._0_8_ != local_560 + 0x10) {
          operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
        }
        local_4d0[0] = local_570[0];
        plVar24 = local_580;
        if (local_580 != local_570) goto LAB_00b02dcf;
      }
    }
    else {
      local_4e0 = local_4d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4e0,"work does not exceed active chainstate","");
      local_4c0._0_8_ = local_4c0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4c0,local_4e0,local_4d8 + (long)local_4e0);
      local_4a0._M_p = (pointer)&local_490;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a0,local_4e0,local_4d8 + (long)local_4e0);
      ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                (&local_480,&cleanup_bad_snapshot,(bilingual_str *)local_4c0);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
      paVar2 = &local_480.message.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480.message.original._M_dataplus._M_p == paVar2) {
        *puVar1 = CONCAT71(local_480.message.original.field_2._M_allocated_capacity._1_7_,
                           local_480.message.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
             local_480.message.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
             local_480.message.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
             CONCAT71(local_480.message.original.field_2._M_allocated_capacity._1_7_,
                      local_480.message.original.field_2._M_local_buf[0]);
      }
      paVar3 = &local_480.message.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
           local_480.message.original._M_string_length;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_CBlockIndex_*>.
                       super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                       super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                       super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480.message.translated._M_dataplus._M_p == paVar3) {
        *puVar1 = CONCAT71(local_480.message.translated.field_2._M_allocated_capacity._1_7_,
                           local_480.message.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
             local_480.message.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_CBlockIndex_*>.
                 super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                 super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                 super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
             local_480.message.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_CBlockIndex_*>.
                          super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                          super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                          super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
             CONCAT71(local_480.message.translated.field_2._M_allocated_capacity._1_7_,
                      local_480.message.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
           local_480.message.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
      local_480.message.translated.field_2._M_local_buf[0] = '\0';
      local_480.message.translated._M_string_length = 0;
      local_480.message.original.field_2._M_local_buf[0] = '\0';
      local_480.message.original._M_string_length = 0;
      local_480.message.original._M_dataplus._M_p = (pointer)paVar2;
      local_480.message.translated._M_dataplus._M_p = (pointer)paVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != &local_490) {
        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
        operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
      }
      plVar24 = local_4e0;
      if (local_4e0 != local_4d0) {
LAB_00b02dcf:
        operator_delete(plVar24,local_4d0[0] + 1);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock48.super_unique_lock);
  }
  else {
    criticalblock43.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock43.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
    local_400 = local_3f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Population failed: %s","")
    ;
    criticalblock48.super_unique_lock._M_device = (mutex_type *)local_3d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&criticalblock48,local_400,local_3f8 + (long)local_400);
    local_3d0._16_8_ = &local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3d0 + 0x10),local_400,local_3f8 + (long)local_400);
    util::ErrorString<void>((bilingual_str *)&heights_formatted,(Result<void> *)&ret);
    tinyformat::format<bilingual_str>
              (&local_3a0,(bilingual_str *)&criticalblock48,(bilingual_str *)&heights_formatted);
    ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
              (&local_360,&cleanup_bad_snapshot,&local_3a0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
      super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
      super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
      super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> = puVar1;
    paVar2 = &local_360.message.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.message.original._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_360.message.original.field_2._M_allocated_capacity._1_7_,
                         local_360.message.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x18) =
           local_360.message.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> =
           local_360.message.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x10) =
           CONCAT71(local_360.message.original.field_2._M_allocated_capacity._1_7_,
                    local_360.message.original.field_2._M_local_buf[0]);
    }
    paVar3 = &local_360.message.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 8) =
         local_360.message.original._M_string_length;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_CBlockIndex_*>.
                     super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                     super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                     super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360.message.translated._M_dataplus._M_p == paVar3) {
      *puVar1 = CONCAT71(local_360.message.translated.field_2._M_allocated_capacity._1_7_,
                         local_360.message.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x38) =
           local_360.message.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>
               .super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
               super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
               super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x20) =
           local_360.message.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_CBlockIndex_*>.
                        super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
                        super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
                        super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x30) =
           CONCAT71(local_360.message.translated.field_2._M_allocated_capacity._1_7_,
                    local_360.message.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x28) =
         local_360.message.translated._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_CBlockIndex_*>.
             super__Move_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_assign_alias<bilingual_str,_CBlockIndex_*>.
             super__Move_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Copy_ctor_alias<bilingual_str,_CBlockIndex_*>.
             super__Variant_storage_alias<bilingual_str,_CBlockIndex_*> + 0x40) = '\0';
    local_360.message.translated.field_2._M_local_buf[0] = '\0';
    local_360.message.translated._M_string_length = 0;
    local_360.message.original.field_2._M_local_buf[0] = '\0';
    local_360.message.original._M_string_length = 0;
    local_360.message.original._M_dataplus._M_p = (pointer)paVar2;
    local_360.message.translated._M_dataplus._M_p = (pointer)paVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0.translated._M_dataplus._M_p != &local_3a0.translated.field_2) {
      operator_delete(local_3a0.translated._M_dataplus._M_p,
                      local_3a0.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0.original._M_dataplus._M_p != &local_3a0.original.field_2) {
      operator_delete(local_3a0.original._M_dataplus._M_p,
                      local_3a0.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_p != &local_410) {
      operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)heights_formatted._M_dataplus._M_p != &heights_formatted.field_2) {
      operator_delete(heights_formatted._M_dataplus._M_p,
                      heights_formatted.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._16_8_ != &local_3b0) {
      operator_delete((void *)local_3d0._16_8_,local_3b0._M_allocated_capacity + 1);
    }
    if (criticalblock48.super_unique_lock._M_device != (mutex_type *)local_3d0) {
      operator_delete(criticalblock48.super_unique_lock._M_device,local_3d0._0_8_ + 1);
    }
    if (local_400 != local_3f0) {
      operator_delete(local_400,local_3f0[0] + 1);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&ret);
  }
  if ((__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)
      snapshot_chainstate._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
      _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)0x0) {
    std::default_delete<Chainstate>::operator()
              ((default_delete<Chainstate> *)&snapshot_chainstate,
               (Chainstate *)
               snapshot_chainstate._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
  }
LAB_00b02f08:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }